

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

Matrix * rw::Matrix::mult(Matrix *dst,Matrix *src1,Matrix *src2)

{
  Matrix *src2_local;
  Matrix *src1_local;
  Matrix *dst_local;
  
  if ((src1->flags & 0x20000) == 0) {
    if ((src2->flags & 0x20000) == 0) {
      mult_(dst,src1,src2);
      dst->flags = src1->flags & src2->flags;
    }
    else {
      memcpy(dst,src1,0x40);
    }
  }
  else {
    memcpy(dst,src2,0x40);
  }
  return dst;
}

Assistant:

Matrix*
Matrix::mult(Matrix *dst, const Matrix *src1, const Matrix *src2)
{
	if(src1->flags & IDENTITY)
		*dst = *src2;
	else if(src2->flags & IDENTITY)
		*dst = *src1;
	else{
		mult_(dst, src1, src2);
		dst->flags = src1->flags & src2->flags;
	}
	return dst;
}